

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_CtypeOnNonStringFieldTest_Test::
~CppGeneratorTest_CtypeOnNonStringFieldTest_Test
          (CppGeneratorTest_CtypeOnNonStringFieldTest_Test *this)

{
  CppGeneratorTest_CtypeOnNonStringFieldTest_Test *this_local;
  
  ~CppGeneratorTest_CtypeOnNonStringFieldTest_Test(this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, CtypeOnNonStringFieldTest) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    message Foo {
      int32 bar = 1 [ctype=STRING];
    })schema");
  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Field Foo.bar specifies string_type, but is not a string nor bytes "
      "field.");
}